

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_particle_set.cpp
# Opt level: O0

void __thiscall
PP_particle_set::PP_particle_set(PP_particle_set *this,int N,double _R,double _m,double _e)

{
  int local_98;
  int i;
  undefined1 local_88 [8];
  PP_particle p_default;
  double _e_local;
  double _m_local;
  double _R_local;
  int N_local;
  PP_particle_set *this_local;
  
  p_default.e = _e;
  std::vector<PP_particle,_std::allocator<PP_particle>_>::vector(&this->S);
  this->alpha = 1.0;
  PP_particle::PP_particle((PP_particle *)local_88);
  p_default.m = p_default.e;
  p_default.super_PP_object.v.z = _R;
  p_default.super_PP_object.dt = _m;
  for (local_98 = 0; local_98 < N; local_98 = local_98 + 1) {
    std::vector<PP_particle,_std::allocator<PP_particle>_>::push_back
              (&this->S,(value_type *)local_88);
  }
  PP_particle::~PP_particle((PP_particle *)local_88);
  return;
}

Assistant:

PP_particle_set::PP_particle_set(int N, double _R, double _m, double _e)
{
    alpha=1.0;
    PP_particle p_default;
    p_default.R=_R;
    p_default.m=_m;
    p_default.e=_e;
    for(int i=0 ; i<N ; i++)
        S.push_back(p_default);
}